

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall argo::json::reset(json *this)

{
  type tVar1;
  
  tVar1 = this->m_type;
  if (tVar1 == string_e) {
    std::__cxx11::string::~string((string *)&(this->m_value).u_object);
  }
  else if (tVar1 == array_e) {
    std::
    vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
    ::~vector((vector<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>,_std::allocator<std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>
               *)&(this->m_value).u_object);
  }
  else if (tVar1 == object_e) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<argo::json,_std::default_delete<argo::json>_>_>_>_>
    ::~_Rb_tree(&(this->m_value).u_object._M_t);
  }
  this->m_type = null_e;
  (this->m_raw_value)._M_string_length = 0;
  *(this->m_raw_value)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void json::reset()
{
    switch (m_type)
    {
    case object_e:
        destroy_object();
        break;
    case array_e:
        destroy_array();
        break;
    case string_e:
        destroy_string();
        break;
    default:
        break;
    }

    m_type = null_e;
    m_raw_value.clear();
}